

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

int cmFortranParser_Input(cmFortranParser *parser,char *buffer,size_t bufferSize)

{
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  FILE *file;
  size_t bufferSize_local;
  char *buffer_local;
  cmFortranParser *parser_local;
  
  bVar1 = std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::
          empty(&parser->FileStack);
  if (bVar1) {
    parser_local._4_4_ = 0;
  }
  else {
    pvVar2 = std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::
             top(&parser->FileStack);
    sVar3 = fread(buffer,1,bufferSize,(FILE *)pvVar2->File);
    parser_local._4_4_ = (int)sVar3;
  }
  return parser_local._4_4_;
}

Assistant:

int cmFortranParser_Input(cmFortranParser* parser,
                                 char* buffer, size_t bufferSize)
{
  // Read from the file on top of the stack.  If the stack is empty,
  // the end of the translation unit has been reached.
  if(!parser->FileStack.empty())
    {
    FILE* file = parser->FileStack.top().File;
    return (int)fread(buffer, 1, bufferSize, file);
    }
  return 0;
}